

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O1

MemTxResult
flatview_read_continue_arm
          (uc_struct_conflict1 *uc,FlatView *fv,hwaddr addr,MemTxAttrs attrs,void *ptr,hwaddr len,
          hwaddr addr1,hwaddr l,MemoryRegion *mr)

{
  long lVar1;
  MemTxResult MVar2;
  void *__src;
  MemoryRegion *mr_00;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uc_struct_conflict1 *uc_00;
  MemOp op;
  uint uVar6;
  uc_struct_conflict1 *__dest;
  uint64_t val;
  uint64_t local_38;
  
  uVar6 = 0;
  mr_00 = mr;
  __dest = (uc_struct_conflict1 *)ptr;
  while( true ) {
    if (mr_00->ram == false) {
      uVar3 = (mr_00->ops->valid).max_access_size;
      if (uVar3 == 0) {
        uVar3 = 4;
      }
      if ((mr_00->ops->impl).unaligned == false) {
        uVar4 = -(uint)addr1 & (uint)addr1;
        uVar5 = uVar4;
        if (uVar3 < uVar4) {
          uVar5 = uVar3;
        }
        if (uVar4 != 0) {
          uVar3 = uVar5;
        }
      }
      if (uVar3 < (uint)l) {
        l._0_4_ = uVar3;
      }
      lVar1 = 0x3f;
      if ((uint)l != 0) {
        for (; (uint)l >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      uVar3 = (uint)(0x8000000000000000 >> (~(byte)lVar1 & 0x3f));
      if ((uint)l == 0) {
        uVar3 = 0;
      }
      l = (hwaddr)(int)uVar3;
      if (uVar3 == 0) {
        op = MO_ALIGN_4;
      }
      else {
        op = MO_8;
        if (uVar3 != 0) {
          for (; (uVar3 >> op & 1) == 0; op = op + MO_16) {
          }
        }
      }
      uc_00 = uc;
      MVar2 = memory_region_dispatch_read_arm(uc,mr_00,addr1,&local_38,op,attrs);
      uVar6 = MVar2 | uVar6;
      switch((uint)l) {
      case 1:
        *(char *)&__dest->arch = (char)local_38;
        break;
      case 2:
        *(short *)&__dest->arch = (short)local_38;
        break;
      case 4:
        __dest->arch = (uc_arch)local_38;
        break;
      case 8:
        __dest->arch = (undefined4)local_38;
        __dest->mode = local_38._4_4_;
      }
    }
    else {
      __src = qemu_ram_ptr_length((uc_struct_conflict1 *)fv->root->uc,mr_00->ram_block,addr1,&l,
                                  SUB81(ptr,0));
      uc_00 = __dest;
      memcpy(__dest,__src,l);
    }
    len = len - l;
    if (len == 0) break;
    addr = addr + l;
    __dest = (uc_struct_conflict1 *)((long)&__dest->arch + l);
    ptr = &l;
    l = len;
    mr_00 = flatview_translate_arm(uc_00,fv,addr,&addr1,(hwaddr *)ptr,false,attrs);
  }
  return uVar6;
}

Assistant:

MemTxResult flatview_read_continue(struct uc_struct *uc, FlatView *fv, hwaddr addr,
                                   MemTxAttrs attrs, void *ptr,
                                   hwaddr len, hwaddr addr1, hwaddr l,
                                   MemoryRegion *mr)
{
    uint8_t *ram_ptr;
    uint64_t val;
    MemTxResult result = MEMTX_OK;
    bool release_lock = false;
    uint8_t *buf = ptr;

    for (;;) {
        if (!memory_access_is_direct(mr, false)) {
            /* I/O case */
            release_lock |= prepare_mmio_access(mr);
            l = memory_access_size(mr, l, addr1);
            result |= memory_region_dispatch_read(uc, mr, addr1, &val,
                                                  size_memop(l), attrs);
            stn_he_p(buf, l, val);
        } else {
            /* RAM case */
            ram_ptr = qemu_ram_ptr_length(fv->root->uc, mr->ram_block, addr1, &l, false);
            memcpy(buf, ram_ptr, l);
        }

        if (release_lock) {
            release_lock = false;
        }

        len -= l;
        buf += l;
        addr += l;

        if (!len) {
            break;
        }

        l = len;
        mr = flatview_translate(uc, fv, addr, &addr1, &l, false, attrs);
    }

    return result;
}